

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O2

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::CheckConstraint::Deserialize(CheckConstraint *this,Deserializer *deserializer)

{
  CheckConstraint *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  ParsedExpression *local_18;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((Deserializer *)&stack0xffffffffffffffe8,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (CheckConstraint *)operator_new(0x18);
  local_20._M_head_impl = local_18;
  local_18 = (ParsedExpression *)0x0;
  CheckConstraint(this_00,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_20);
  if (local_20._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_20._M_head_impl = (ParsedExpression *)0x0;
  (this->super_Constraint)._vptr_Constraint = (_func_int **)this_00;
  if (local_18 != (ParsedExpression *)0x0) {
    (**(code **)(*(_func_int **)local_18 + 8))();
  }
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> CheckConstraint::Deserialize(Deserializer &deserializer) {
	auto expression = deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "expression");
	auto result = duckdb::unique_ptr<CheckConstraint>(new CheckConstraint(std::move(expression)));
	return std::move(result);
}